

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_error.hpp
# Opt level: O0

string * __thiscall
jsoncons::cbor::cbor_error_category_impl::message_abi_cxx11_(cbor_error_category_impl *this,int ev)

{
  undefined4 in_EDX;
  string *in_RDI;
  allocator<char> *in_stack_ffffffffffffff80;
  allocator<char> *paVar1;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  undefined1 local_28 [2];
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15 [21];
  
  switch(in_EDX) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)(local_28 + 1));
    break;
  case 5:
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)local_28);
    break;
  case 6:
    paVar1 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,(char *)paVar1,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 7:
    paVar1 = &local_2a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,paVar1);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_2f);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_30);
  }
  return in_RDI;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<cbor_errc>(ev))
        {
            case cbor_errc::unexpected_eof:
                return "Unexpected end of file";
            case cbor_errc::source_error:
                return "Source error";
            case cbor_errc::invalid_decimal_fraction:
                return "Invalid decimal fraction";
            case cbor_errc::invalid_bigfloat:
                return "Invalid bigfloat";
            case cbor_errc::invalid_utf8_text_string:
                return "Illegal UTF-8 encoding in text string";
            case cbor_errc::too_many_items:
                return "Too many items were added to a CBOR map or array of known length";
            case cbor_errc::too_few_items:
                return "Too few items were added to a CBOR map or array of known length";
            case cbor_errc::number_too_large:
                return "Number exceeds implementation limits";
            case cbor_errc::stringref_too_large:
                return "stringref exceeds stringref map size";
            case cbor_errc::max_nesting_depth_exceeded:
                return "Data item nesting exceeds limit in options";
            case cbor_errc::unknown_type:
                return "An unknown type was found in the stream";
            case cbor_errc::illegal_chunked_string:
                return "An illegal type was found while parsing an indefinite length string";
            default:
                return "Unknown CBOR parser error";
        }
    }